

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

bool __thiscall
pegmatite::ASTString::construct
          (ASTString *this,InputRange *r,ASTStack *param_2,ErrorReporter *param_3)

{
  Input *pIVar1;
  Index IVar2;
  char32_t cVar3;
  stringstream stream;
  iterator local_1d0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1d0[0].buffer = (r->start).it.buffer;
  pIVar1 = (r->finish).it.buffer;
  IVar2 = (r->finish).it.idx;
  for (local_1d0[0].idx = (r->start).it.idx;
      (local_1d0[0].buffer != pIVar1 || (local_1d0[0].idx != IVar2));
      local_1d0[0].idx = local_1d0[0].idx + 1) {
    cVar3 = Input::iterator::operator*(local_1d0);
    std::operator<<(local_1a0,(char)cVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->super_string,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return true;
}

Assistant:

bool ASTString::construct(const pegmatite::InputRange &r, pegmatite::ASTStack &,
                          const ErrorReporter &)
{
	std::stringstream stream;
	std::for_each(r.begin(),
	         r.end(),
	         [&](char32_t c) {stream << static_cast<char>(c);});
	this->std::string::operator=(stream.str());

	return true;
}